

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O2

int __thiscall
PFData::fileReadSubgridAtGridIndexInternal
          (PFData *this,double *buffer,FILE *fp,int gridZ,int gridY,int gridX)

{
  long lVar1;
  size_t sVar2;
  double dVar3;
  int *piVar4;
  size_t i;
  int iVar5;
  size_t __n;
  
  lVar1 = getSubgridOffset(this,gridZ,gridY,gridX);
  fseek((FILE *)fp,lVar1 + 0x24,0);
  iVar5 = this->m_p;
  __n = (size_t)(int)(((uint)(gridX < this->m_nz % this->m_r) + this->m_nz / this->m_r) *
                     ((uint)(gridY < this->m_ny % this->m_q) + this->m_ny / iVar5) *
                     ((uint)(gridZ < this->m_nx % iVar5) + this->m_nx / iVar5));
  sVar2 = fread(buffer,8,__n,(FILE *)fp);
  if (sVar2 == __n) {
    iVar5 = 0;
    for (sVar2 = 0; __n != sVar2; sVar2 = sVar2 + 1) {
      dVar3 = (double)bswap64((uint64_t)buffer[sVar2]);
      buffer[sVar2] = dVar3;
    }
  }
  else {
    piVar4 = __errno_location();
    iVar5 = *piVar4;
  }
  return iVar5;
}

Assistant:

int PFData::fileReadSubgridAtGridIndexInternal(double* buffer, std::FILE* fp, int gridZ, int gridY, int gridX) const{
    const long long offset = getSubgridOffset(gridZ, gridY, gridX) + 36; //Skip header
    std::fseek(fp, offset, SEEK_SET);

    static_assert(sizeof(double) == 8, "Double must be 8 bytes");

    //Number of elements to read
    const long long count = getSubgridSizeX(gridZ) * getSubgridSizeY(gridY) * getSubgridSizeZ(gridX);

    std::size_t numRead = std::fread(buffer, 8, count, fp);
    if(numRead != static_cast<std::size_t>(count)){
        return errno;
    }

    //Perform endian conversion
    for(std::size_t i = 0; i < count; ++i){
        uint64_t tmp = *reinterpret_cast<uint64_t*>(&buffer[i]);
        tmp = bswap64(tmp);
        buffer[i] = *reinterpret_cast<double*>(&tmp);
    }

    return 0;
}